

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Voice::noteOn(V2Voice *this,int note,int vel)

{
  undefined8 *puVar1;
  float fVar2;
  V2Instance *pVVar3;
  V2Flt *pVVar4;
  long lVar5;
  V2Osc *this_00;
  int i;
  float fVar6;
  
  this->note = note;
  fVar2 = this->xpose;
  this_00 = this->osc;
  lVar5 = 0;
  do {
    *(float *)((long)&this->osc[0].note + lVar5) = (float)note + fVar2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0xc0);
  this->velo = (float)vel;
  this->gate = true;
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&this->env[0].state + lVar5) = 2;
    lVar5 = lVar5 + 0x24;
  } while (lVar5 == 0x24);
  if (this->keysync != 1) {
    if (this->keysync != 2) goto LAB_0010bd9d;
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&this->env[0].val + lVar5) = 0;
      lVar5 = lVar5 + 0x24;
    } while (lVar5 == 0x24);
    this->curvol = 0.0;
    lVar5 = 0;
    do {
      V2Osc::init(this_00,(EVP_PKEY_CTX *)this->inst);
      lVar5 = lVar5 + 1;
      this_00 = this_00 + 1;
    } while (lVar5 != 3);
    lVar5 = 0;
    do {
      pVVar3 = this->inst;
      puVar1 = (undefined8 *)((long)this->vcf[0].moog.b + lVar5 + 4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)this->vcf[0].moog.b + lVar5 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(V2Instance **)((long)(&this->vcf[0].moog + 1) + lVar5 + 4) = pVVar3;
      lVar5 = lVar5 + 0x40;
    } while (lVar5 == 0x40);
    pVVar3 = this->inst;
    (this->dist).dcount = 0;
    (this->dist).dvall = 0.0;
    (this->dist).dvalr = 0.0;
    (this->dist).fltl.lrc.l = 0.0;
    (this->dist).fltl.lrc.b = 0.0;
    (this->dist).fltl.moog.b[0] = 0.0;
    (this->dist).fltl.moog.b[1] = 0.0;
    pVVar4 = &(this->dist).fltl;
    (pVVar4->moog).b[1] = 0.0;
    (pVVar4->moog).b[2] = 0.0;
    pVVar4 = &(this->dist).fltl;
    (pVVar4->moog).b[3] = 0.0;
    (pVVar4->moog).b[4] = 0.0;
    (this->dist).fltl.inst = pVVar3;
    (this->dist).fltr.lrc.l = 0.0;
    (this->dist).fltr.lrc.b = 0.0;
    (this->dist).fltr.moog.b[0] = 0.0;
    (this->dist).fltr.moog.b[1] = 0.0;
    pVVar4 = &(this->dist).fltr;
    (pVVar4->moog).b[1] = 0.0;
    (pVVar4->moog).b[2] = 0.0;
    pVVar4 = &(this->dist).fltr;
    (pVVar4->moog).b[3] = 0.0;
    (pVVar4->moog).b[4] = 0.0;
    (this->dist).fltr.inst = pVVar3;
  }
  lVar5 = 0x38;
  do {
    *(undefined4 *)((long)this->osc + lVar5 + -0x30) = 0;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0xf8);
LAB_0010bd9d:
  lVar5 = 0;
  do {
    fVar2 = *(float *)(*(long *)((long)&this->osc[0].inst + lVar5) + 8);
    fVar6 = exp2f(((*(float *)((long)&this->osc[0].pitch + lVar5) + 64.0) * 0.0078125 + -1.0) * 10.0
                 );
    *(float *)((long)&this->osc[0].nffrq + lVar5) = fVar6 * fVar2;
    fVar2 = *(float *)(*(long *)((long)&this->osc[0].inst + lVar5) + 4);
    fVar6 = exp2f((*(float *)((long)&this->osc[0].pitch + lVar5) +
                   *(float *)((long)&this->osc[0].note + lVar5) + -60.0) / 12.0);
    *(int *)((long)&this->osc[0].freq + lVar5) = (int)(fVar6 * fVar2);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0xc0);
  lVar5 = 0;
  do {
    if ((&this->lfo[0].sync)[lVar5] == true) {
      *(undefined4 *)((long)&this->lfo[0].cntr + lVar5) =
           *(undefined4 *)((long)&this->lfo[0].cphase + lVar5);
      *(undefined4 *)((long)&this->lfo[0].last + lVar5) = 0xffffffff;
    }
    lVar5 = lVar5 + 0x28;
  } while (lVar5 == 0x28);
  (this->dcf).inst = this->inst;
  (this->dcf).fl.xm1 = 0.0;
  (this->dcf).fl.ym1 = 0.0;
  (this->dcf).fr.xm1 = 0.0;
  (this->dcf).fr.ym1 = 0.0;
  return;
}

Assistant:

void noteOn(int note, int vel)
    {
        this->note = note;
        updateNote();

        velo = (float)vel;
        gate = true;

        // reset EGs
        for (int i=0; i < syVV2::NENV; i++)
            env[i].state = V2Env::ATTACK;

        // process sync
        switch (keysync)
        {
        case SYNC_FULL:
            COVER("VOICE noteOn sync full");
            for (int i=0; i < syVV2::NENV; i++)
                env[i].val = 0.0f;
            curvol = 0.0f;

            for (int i=0; i < syVV2::NOSC; i++)
                osc[i].init(inst, i);

            for (int i=0; i < syVV2::NFLT; i++)
                vcf[i].init(inst);

            dist.init(inst);
            // fall-through

        case SYNC_OSC:
            COVER("VOICE noteOn sync osc");
            for (int i=0; i < syVV2::NOSC; i++)
                osc[i].cnt = 0;
            // fall-through

        case SYNC_NONE:
        default:
            break;
        }

        for (int i=0; i < syVV2::NOSC; i++)
            osc[i].chgPitch();

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].keyOn();

        dcf.init(inst);
    }